

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestPackedTypesLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestPackedTypesLite *_this;
  TestPackedTypesLite *local_20;
  LogMessageFatal local_18;
  
  local_20 = (TestPackedTypesLite *)to_msg;
  local_18.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestPackedTypesLite_const*,proto2_unittest::TestPackedTypesLite*>
                          ((TestPackedTypesLite **)&local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.packed_int32_,(RepeatedField<int> *)(from_msg + 1));
    google::protobuf::RepeatedField<long>::MergeFrom
              (&(local_20->field_0)._impl_.packed_int64_,
               (RepeatedField<long> *)&from_msg[2]._internal_metadata_);
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              (&(local_20->field_0)._impl_.packed_uint32_,
               (RepeatedField<unsigned_int> *)(from_msg + 4));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              (&(local_20->field_0)._impl_.packed_uint64_,
               (RepeatedField<unsigned_long> *)&from_msg[5]._internal_metadata_);
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.packed_sint32_,(RepeatedField<int> *)(from_msg + 7));
    google::protobuf::RepeatedField<long>::MergeFrom
              (&(local_20->field_0)._impl_.packed_sint64_,
               (RepeatedField<long> *)&from_msg[8]._internal_metadata_);
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              (&(local_20->field_0)._impl_.packed_fixed32_,
               (RepeatedField<unsigned_int> *)(from_msg + 10));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              (&(local_20->field_0)._impl_.packed_fixed64_,
               (RepeatedField<unsigned_long> *)(from_msg + 0xb));
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.packed_sfixed32_,(RepeatedField<int> *)(from_msg + 0xc));
    google::protobuf::RepeatedField<long>::MergeFrom
              (&(local_20->field_0)._impl_.packed_sfixed64_,(RepeatedField<long> *)(from_msg + 0xd))
    ;
    google::protobuf::RepeatedField<float>::MergeFrom
              (&(local_20->field_0)._impl_.packed_float_,(RepeatedField<float> *)(from_msg + 0xe));
    google::protobuf::RepeatedField<double>::MergeFrom
              (&(local_20->field_0)._impl_.packed_double_,(RepeatedField<double> *)(from_msg + 0xf))
    ;
    google::protobuf::RepeatedField<bool>::MergeFrom
              (&(local_20->field_0)._impl_.packed_bool_,(RepeatedField<bool> *)(from_msg + 0x10));
    google::protobuf::RepeatedField<int>::MergeFrom
              (&(local_20->field_0)._impl_.packed_enum_,(RepeatedField<int> *)(from_msg + 0x11));
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(local_20->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x155d,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

void TestPackedTypesLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestPackedTypesLite*>(&to_msg);
  auto& from = static_cast<const TestPackedTypesLite&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestPackedTypesLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_packed_int32()->MergeFrom(from._internal_packed_int32());
  _this->_internal_mutable_packed_int64()->MergeFrom(from._internal_packed_int64());
  _this->_internal_mutable_packed_uint32()->MergeFrom(from._internal_packed_uint32());
  _this->_internal_mutable_packed_uint64()->MergeFrom(from._internal_packed_uint64());
  _this->_internal_mutable_packed_sint32()->MergeFrom(from._internal_packed_sint32());
  _this->_internal_mutable_packed_sint64()->MergeFrom(from._internal_packed_sint64());
  _this->_internal_mutable_packed_fixed32()->MergeFrom(from._internal_packed_fixed32());
  _this->_internal_mutable_packed_fixed64()->MergeFrom(from._internal_packed_fixed64());
  _this->_internal_mutable_packed_sfixed32()->MergeFrom(from._internal_packed_sfixed32());
  _this->_internal_mutable_packed_sfixed64()->MergeFrom(from._internal_packed_sfixed64());
  _this->_internal_mutable_packed_float()->MergeFrom(from._internal_packed_float());
  _this->_internal_mutable_packed_double()->MergeFrom(from._internal_packed_double());
  _this->_internal_mutable_packed_bool()->MergeFrom(from._internal_packed_bool());
  _this->_internal_mutable_packed_enum()->MergeFrom(from._internal_packed_enum());
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}